

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

ostream * __thiscall smf::Options::printOptionList(Options *this,ostream *out)

{
  ostream *this_00;
  long *plVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_optionList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    this_00 = std::__ostream_insert<char,std::char_traits<char>>
                        (out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"\t",1);
    plVar1 = (long *)std::ostream::operator<<((ostream *)this_00,p_Var2[2]._M_color);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  return out;
}

Assistant:

std::ostream& Options::printOptionList(std::ostream& out) {
	for (auto &item : m_optionList) {
		out << item.first << "\t" << item.second << std::endl;
	}
	return out;
}